

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * __thiscall
CTape::produce_letter_abi_cxx11_(string *__return_storage_ptr__,CTape *this,char letter)

{
  pointer pCVar1;
  string *__rhs;
  uint uVar2;
  int iVar3;
  mapped_type *pmVar4;
  uint uVar5;
  ulong in_RCX;
  size_type i;
  ulong uVar7;
  long lVar8;
  double __x;
  double __x_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CNumber<30> *local_80;
  l2t_t *local_78;
  string *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  uint local_44;
  int local_40;
  uint local_3c;
  int local_38;
  allocator<char> local_32;
  char local_31 [8];
  char letter_local;
  int iVar6;
  
  local_31[0] = letter;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"producing letter ",&local_32);
  std::operator+(&local_68,&local_a0,letter);
  debug::log(__x);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_a0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_80 = &this->m_pos;
  local_78 = &this->m_l2t;
  local_3c = 0x39;
  local_38 = -1;
  lVar8 = 0;
  local_70 = __return_storage_ptr__;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(this->m_tape).
                            super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->m_tape).
                            super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
    uVar5 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) % 0x1e);
    local_68._M_dataplus._M_p._0_4_ = uVar5 + 0x1e;
    if (uVar5 < 0xffffffe2) {
      local_68._M_dataplus._M_p._0_4_ = uVar5;
    }
    uVar2 = CNumber<30>::shortest(local_80,(type *)&local_68);
    pCVar1 = (this->m_tape).super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pmVar4 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](local_78,local_31);
    uVar5 = *pmVar4 % 0x1b;
    local_68._M_dataplus._M_p._0_4_ = uVar5 + 0x1b;
    if (uVar5 < 0xffffffe5) {
      local_68._M_dataplus._M_p._0_4_ = uVar5;
    }
    iVar3 = CNumber<27>::shortest
                      ((CNumber<27> *)((long)&pCVar1->m_number + lVar8),(type *)&local_68);
    uVar5 = -uVar2;
    if (0 < (int)uVar2) {
      uVar5 = uVar2;
    }
    iVar6 = -iVar3;
    if (0 < iVar3) {
      iVar6 = iVar3;
    }
    uVar5 = iVar6 + uVar5;
    in_RCX = (ulong)uVar5;
    if ((int)uVar5 < (int)local_3c) {
      local_44 = uVar2;
      local_40 = iVar3;
      local_3c = uVar5;
      local_38 = (int)uVar7;
    }
    lVar8 = lVar8 + 4;
  }
  get_algorithm_abi_cxx11_(&local_68,(CTape *)(ulong)local_44,local_40,(int)in_RCX);
  __rhs = local_70;
  std::__cxx11::string::operator=((string *)local_70,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pmVar4 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
           operator[](local_78,local_31);
  uVar5 = *pmVar4 % 0x1b;
  uVar2 = uVar5 + 0x1b;
  if (uVar5 < 0xffffffe5) {
    uVar2 = uVar5;
  }
  (this->m_tape).super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>._M_impl.
  super__Vector_impl_data._M_start[local_38].m_number = uVar2;
  uVar5 = local_38 % 0x1e;
  uVar2 = uVar5 + 0x1e;
  if (uVar5 < 0xffffffe2) {
    uVar2 = uVar5;
  }
  (this->m_pos).m_number = uVar2;
  std::operator+(&local_68,"produced result: ",__rhs);
  debug::log(__x_00);
  std::__cxx11::string::~string((string *)&local_68);
  return __rhs;
}

Assistant:

std::string produce_letter(const char letter)
        {
            debug::log(std::string("producing letter ") + letter);
            std::string result;
            int min_pos = -1;
            int min_dist = TAPE_LENGTH + LETTERS_COUNT;  // Above in any way
            int min_move, min_change;
            for (tape_t::size_type i = 0; i < m_tape.size(); ++i)
            {
                int dist_move = m_pos.shortest(i);
                int dist_change = m_tape[i].shortest(m_l2t[letter]);
                int dist_res = std::abs(dist_move) + std::abs(dist_change);
                if (min_dist > dist_res)
                {
                    min_dist = dist_res;
                    min_move = dist_move;
                    min_change = dist_change;
                    min_pos = i;
                }
            }

            if (-1 == min_pos)
            {
                assert("broken logic");
            }

            result = get_algorithm(min_move, min_change);
            m_tape[min_pos] = m_l2t[letter];    // change tape
            m_pos = min_pos;                    // move pointer
            debug::log("produced result: " + result);
            return result;
        }